

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Cluster::WriteClusterHeader(Cluster *this)

{
  IMkvWriter *writer;
  bool bVar1;
  int32 iVar2;
  int iVar3;
  undefined4 extraout_var;
  uint64_t uVar4;
  uint64 size;
  Cluster *this_local;
  
  if ((this->finalized_ & 1U) == 0) {
    iVar2 = WriteID(this->writer_,0x1f43b675);
    if (iVar2 == 0) {
      iVar3 = (*this->writer_->_vptr_IMkvWriter[1])();
      this->size_position_ = CONCAT44(extraout_var,iVar3);
      iVar2 = SerializeInt(this->writer_,0x1ffffffffffffff,8);
      if (iVar2 == 0) {
        writer = this->writer_;
        uVar4 = timecode(this);
        iVar3 = 0;
        if ((this->fixed_size_timecode_ & 1U) != 0) {
          iVar3 = 8;
        }
        bVar1 = WriteEbmlElement(writer,0xe7,uVar4,(long)iVar3);
        if (bVar1) {
          uVar4 = timecode(this);
          iVar3 = 0;
          if ((this->fixed_size_timecode_ & 1U) != 0) {
            iVar3 = 8;
          }
          size = EbmlElementSize(0xe7,uVar4,(long)iVar3);
          AddPayloadSize(this,size);
          this->header_written_ = true;
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Cluster::WriteClusterHeader() {
  if (finalized_)
    return false;

  if (WriteID(writer_, libwebm::kMkvCluster))
    return false;

  // Save for later.
  size_position_ = writer_->Position();

  // Write "unknown" (EBML coded -1) as cluster size value. We need to write 8
  // bytes because we do not know how big our cluster will be.
  if (SerializeInt(writer_, kEbmlUnknownValue, 8))
    return false;

  if (!WriteEbmlElement(writer_, libwebm::kMkvTimecode, timecode(),
                        fixed_size_timecode_ ? 8 : 0)) {
    return false;
  }
  AddPayloadSize(EbmlElementSize(libwebm::kMkvTimecode, timecode(),
                                 fixed_size_timecode_ ? 8 : 0));
  header_written_ = true;

  return true;
}